

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  int iVar27;
  undefined4 uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  undefined4 uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  ulong *puVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  vint4 ai_1;
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  vint4 ai;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar57;
  float fVar58;
  float fVar66;
  float fVar68;
  vint4 ai_3;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  vint4 ai_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar101;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  ulong *local_cd8;
  RTCFilterFunctionNArguments local_bf0;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  undefined1 local_ba0 [32];
  undefined8 local_b80;
  uint uStack_b78;
  uint uStack_b74;
  uint uStack_b70;
  uint uStack_b6c;
  uint uStack_b68;
  uint uStack_b64;
  undefined1 local_b60 [32];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a00 [32];
  float local_9e0 [4];
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar101 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar114 = ZEXT1664(CONCAT412(fVar101,CONCAT48(fVar101,CONCAT44(fVar101,fVar101))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_b10._4_4_ = fVar2;
  local_b10._0_4_ = fVar2;
  local_b10._8_4_ = fVar2;
  local_b10._12_4_ = fVar2;
  auVar87 = ZEXT1664(local_b10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_b20._4_4_ = fVar3;
  local_b20._0_4_ = fVar3;
  local_b20._8_4_ = fVar3;
  local_b20._12_4_ = fVar3;
  auVar90 = ZEXT1664(local_b20);
  fVar101 = fVar101 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_b30._0_8_ = CONCAT44(fVar101,fVar101) ^ 0x8000000080000000;
  local_b30._8_4_ = -fVar101;
  local_b30._12_4_ = -fVar101;
  auVar95 = ZEXT1664(local_b30);
  local_b40._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_b40._8_4_ = -fVar2;
  local_b40._12_4_ = -fVar2;
  auVar97 = ZEXT1664(local_b40);
  auVar104._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar104._8_4_ = -fVar3;
  auVar104._12_4_ = -fVar3;
  iVar27 = (tray->tnear).field_0.i[k];
  auVar107._4_4_ = iVar27;
  auVar107._0_4_ = iVar27;
  auVar107._8_4_ = iVar27;
  auVar107._12_4_ = iVar27;
  iVar27 = (tray->tfar).field_0.i[k];
  auVar110._4_4_ = iVar27;
  auVar110._0_4_ = iVar27;
  auVar110._8_4_ = iVar27;
  auVar110._12_4_ = iVar27;
  local_ac0._16_16_ = mm_lookupmask_ps._240_16_;
  local_ac0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar27 = 1 << ((uint)k & 0x1f);
  auVar100._4_4_ = iVar27;
  auVar100._0_4_ = iVar27;
  auVar100._8_4_ = iVar27;
  auVar100._12_4_ = iVar27;
  auVar100._16_4_ = iVar27;
  auVar100._20_4_ = iVar27;
  auVar100._24_4_ = iVar27;
  auVar100._28_4_ = iVar27;
  auVar49 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar100 = vpand_avx2(auVar100,auVar49);
  local_b00 = vpcmpeqd_avx2(auVar100,auVar49);
  auVar49._8_4_ = 0xbf800000;
  auVar49._0_8_ = 0xbf800000bf800000;
  auVar49._12_4_ = 0xbf800000;
  auVar49._16_4_ = 0xbf800000;
  auVar49._20_4_ = 0xbf800000;
  auVar49._24_4_ = 0xbf800000;
  auVar49._28_4_ = 0xbf800000;
  auVar53._8_4_ = 0x3f800000;
  auVar53._0_8_ = 0x3f8000003f800000;
  auVar53._12_4_ = 0x3f800000;
  auVar53._16_4_ = 0x3f800000;
  auVar53._20_4_ = 0x3f800000;
  auVar53._24_4_ = 0x3f800000;
  auVar53._28_4_ = 0x3f800000;
  _local_ae0 = vblendvps_avx(auVar53,auVar49,local_ac0);
  local_cd8 = local_7f8;
LAB_016258d9:
  do {
    puVar39 = local_cd8;
    if (puVar39 == &local_800) {
LAB_016263b0:
      return puVar39 != &local_800;
    }
    local_cd8 = puVar39 + -1;
    uVar36 = puVar39[-1];
    while ((uVar36 & 8) == 0) {
      auVar79 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar40),auVar95._0_16_,
                                auVar114._0_16_);
      auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar41),auVar97._0_16_,
                                auVar87._0_16_);
      auVar79 = vpmaxsd_avx(auVar79,auVar48);
      auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar43),auVar104,
                                auVar90._0_16_);
      auVar83 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + (uVar40 ^ 0x10)),
                                auVar95._0_16_,auVar114._0_16_);
      auVar59 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + (uVar41 ^ 0x10)),
                                auVar97._0_16_,auVar87._0_16_);
      auVar83 = vpminsd_avx(auVar83,auVar59);
      auVar59 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + (uVar43 ^ 0x10)),auVar104,
                                auVar90._0_16_);
      auVar48 = vpmaxsd_avx(auVar48,auVar107);
      auVar79 = vpmaxsd_avx(auVar79,auVar48);
      auVar48 = vpminsd_avx(auVar59,auVar110);
      auVar48 = vpminsd_avx(auVar83,auVar48);
      auVar79 = vpcmpgtd_avx(auVar79,auVar48);
      iVar27 = vmovmskps_avx(auVar79);
      if (iVar27 == 0xf) goto LAB_016258d9;
      bVar26 = (byte)iVar27 ^ 0xf;
      uVar29 = uVar36 & 0xfffffffffffffff0;
      lVar31 = 0;
      for (uVar36 = (ulong)bVar26; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar36 = *(ulong *)(uVar29 + lVar31 * 8);
      uVar32 = bVar26 - 1 & (uint)bVar26;
      uVar34 = (ulong)uVar32;
      if (uVar32 != 0) {
        do {
          *local_cd8 = uVar36;
          local_cd8 = local_cd8 + 1;
          lVar31 = 0;
          for (uVar36 = uVar34; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
            lVar31 = lVar31 + 1;
          }
          uVar34 = uVar34 - 1 & uVar34;
          uVar36 = *(ulong *)(uVar29 + lVar31 * 8);
        } while (uVar34 != 0);
      }
    }
    uVar29 = uVar36 & 0xfffffffffffffff0;
    for (lVar31 = 0; lVar31 != (ulong)((uint)uVar36 & 0xf) - 8; lVar31 = lVar31 + 1) {
      lVar30 = lVar31 * 0x58;
      lVar1 = lVar30 + uVar29;
      uVar28 = *(undefined4 *)(uVar29 + 0x38 + lVar30);
      auVar59._4_4_ = uVar28;
      auVar59._0_4_ = uVar28;
      auVar59._8_4_ = uVar28;
      auVar59._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(uVar29 + 0x44 + lVar30);
      auVar75._4_4_ = uVar28;
      auVar75._0_4_ = uVar28;
      auVar75._8_4_ = uVar28;
      auVar75._12_4_ = uVar28;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = *(ulong *)((uVar40 >> 2) + 0x20 + lVar1);
      auVar79 = vpmovzxbd_avx(auVar79);
      auVar79 = vcvtdq2ps_avx(auVar79);
      auVar83 = vfmadd213ps_fma(auVar79,auVar75,auVar59);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)(((uVar40 ^ 0x10) >> 2) + 0x20 + lVar1);
      auVar79 = vpmovzxbd_avx(auVar48);
      auVar79 = vcvtdq2ps_avx(auVar79);
      auVar59 = vfmadd213ps_fma(auVar79,auVar75,auVar59);
      uVar28 = *(undefined4 *)(uVar29 + 0x3c + lVar30);
      auVar76._4_4_ = uVar28;
      auVar76._0_4_ = uVar28;
      auVar76._8_4_ = uVar28;
      auVar76._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(uVar29 + 0x48 + lVar30);
      auVar80._4_4_ = uVar28;
      auVar80._0_4_ = uVar28;
      auVar80._8_4_ = uVar28;
      auVar80._12_4_ = uVar28;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(ulong *)((uVar41 >> 2) + 0x20 + lVar1);
      auVar79 = vpmovzxbd_avx(auVar60);
      auVar79 = vcvtdq2ps_avx(auVar79);
      auVar60 = vfmadd213ps_fma(auVar79,auVar80,auVar76);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(ulong *)(((uVar41 ^ 0x10) >> 2) + 0x20 + lVar1);
      auVar79 = vpmovzxbd_avx(auVar61);
      auVar79 = vcvtdq2ps_avx(auVar79);
      auVar61 = vfmadd213ps_fma(auVar79,auVar80,auVar76);
      uVar28 = *(undefined4 *)(uVar29 + 0x40 + lVar30);
      auVar77._4_4_ = uVar28;
      auVar77._0_4_ = uVar28;
      auVar77._8_4_ = uVar28;
      auVar77._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(uVar29 + 0x4c + lVar30);
      auVar81._4_4_ = uVar28;
      auVar81._0_4_ = uVar28;
      auVar81._8_4_ = uVar28;
      auVar81._12_4_ = uVar28;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = *(ulong *)((uVar43 >> 2) + 0x20 + lVar1);
      auVar79 = vpmovzxbd_avx(auVar85);
      auVar79 = vcvtdq2ps_avx(auVar79);
      auVar75 = vfmadd213ps_fma(auVar79,auVar81,auVar77);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = *(ulong *)(((uVar43 ^ 0x10) >> 2) + 0x20 + lVar1);
      auVar79 = vpmovzxbd_avx(auVar88);
      auVar79 = vcvtdq2ps_avx(auVar79);
      auVar76 = vfmadd213ps_fma(auVar79,auVar81,auVar77);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = *(ulong *)(uVar29 + 0x20 + lVar30);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = *(ulong *)(uVar29 + 0x24 + lVar30);
      auVar48 = vpminub_avx(auVar78,auVar82);
      auVar79 = vpcmpeqb_avx(auVar78,auVar48);
      auVar48 = vpcmpeqd_avx(auVar48,auVar48);
      auVar79 = vpmovzxbd_avx(auVar79 ^ auVar48);
      auVar79 = vpslld_avx(auVar79 ^ auVar48,0x1f);
      uVar28 = vmovmskps_avx(auVar79);
      auVar79 = vfmadd213ps_fma(auVar83,auVar114._0_16_,auVar95._0_16_);
      auVar48 = vfmadd213ps_fma(auVar60,auVar87._0_16_,auVar97._0_16_);
      auVar79 = vpmaxsd_avx(auVar79,auVar48);
      auVar48 = vfmadd213ps_fma(auVar59,auVar114._0_16_,auVar95._0_16_);
      auVar83 = vfmadd213ps_fma(auVar61,auVar87._0_16_,auVar97._0_16_);
      auVar83 = vpminsd_avx(auVar48,auVar83);
      auVar48 = vfmadd213ps_fma(auVar75,auVar90._0_16_,auVar104);
      auVar48 = vpmaxsd_avx(auVar48,auVar107);
      auVar79 = vpmaxsd_avx(auVar79,auVar48);
      auVar48 = vfmadd213ps_fma(auVar76,auVar90._0_16_,auVar104);
      auVar48 = vpminsd_avx(auVar48,auVar110);
      auVar48 = vpminsd_avx(auVar83,auVar48);
      auVar79 = vpcmpgtd_avx(auVar79,auVar48);
      uVar33 = vmovmskps_avx(auVar79);
      for (uVar34 = (ulong)(byte)(~(byte)uVar33 & (byte)uVar28); uVar34 != 0;
          uVar34 = uVar34 - 1 & uVar34) {
        lVar30 = 0;
        for (uVar44 = uVar34; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
          lVar30 = lVar30 + 1;
        }
        uVar4 = *(ushort *)(lVar1 + lVar30 * 8);
        uVar5 = *(ushort *)(lVar1 + 2 + lVar30 * 8);
        uStack_b78 = *(uint *)(lVar1 + 0x50);
        uVar32 = *(uint *)(lVar1 + 4 + lVar30 * 8);
        pGVar7 = (context->scene->geometries).items[uStack_b78].ptr;
        lVar30 = *(long *)&pGVar7->field_0x58;
        lVar42 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (ulong)uVar32;
        uVar37 = uVar4 & 0x7fff;
        uVar38 = uVar5 & 0x7fff;
        uVar6 = *(uint *)(lVar30 + 4 + lVar42);
        uVar46 = (ulong)uVar6;
        uVar35 = (ulong)(uVar6 * uVar38 + *(int *)(lVar30 + lVar42) + uVar37);
        p_Var8 = pGVar7[1].intersectionFilterN;
        lVar9 = *(long *)&pGVar7[1].time_range.upper;
        auVar79 = *(undefined1 (*) [16])(lVar9 + (uVar35 + 1) * (long)p_Var8);
        auVar48 = *(undefined1 (*) [16])(lVar9 + (uVar35 + uVar46) * (long)p_Var8);
        lVar47 = uVar35 + uVar46 + 1;
        auVar83 = *(undefined1 (*) [16])(lVar9 + lVar47 * (long)p_Var8);
        auVar59 = *(undefined1 (*) [16])(lVar9 + (uVar35 + (-1 < (short)uVar4) + 1) * (long)p_Var8);
        lVar45 = (ulong)(-1 < (short)uVar4) + lVar47;
        auVar60 = *(undefined1 (*) [16])(lVar9 + lVar45 * (long)p_Var8);
        uVar44 = 0;
        if (-1 < (short)uVar5) {
          uVar44 = uVar46;
        }
        auVar61 = *(undefined1 (*) [16])(lVar9 + (uVar35 + uVar46 + uVar44) * (long)p_Var8);
        auVar75 = *(undefined1 (*) [16])(lVar9 + (lVar47 + uVar44) * (long)p_Var8);
        auVar92._16_16_ = *(undefined1 (*) [16])(lVar9 + (uVar44 + lVar45) * (long)p_Var8);
        auVar92._0_16_ = auVar83;
        auVar77 = vunpcklps_avx(auVar79,auVar60);
        auVar76 = vunpckhps_avx(auVar79,auVar60);
        auVar78 = vunpcklps_avx(auVar59,auVar83);
        auVar59 = vunpckhps_avx(auVar59,auVar83);
        auVar80 = vunpcklps_avx(auVar76,auVar59);
        auVar81 = vunpcklps_avx(auVar77,auVar78);
        auVar59 = vunpckhps_avx(auVar77,auVar78);
        auVar77 = vunpcklps_avx(auVar48,auVar75);
        auVar76 = vunpckhps_avx(auVar48,auVar75);
        auVar78 = vunpcklps_avx(auVar83,auVar61);
        auVar61 = vunpckhps_avx(auVar83,auVar61);
        auVar76 = vunpcklps_avx(auVar76,auVar61);
        auVar82 = vunpcklps_avx(auVar77,auVar78);
        auVar61 = vunpckhps_avx(auVar77,auVar78);
        auVar62._16_16_ = auVar75;
        auVar62._0_16_ = auVar48;
        auVar54._16_16_ = auVar60;
        auVar54._0_16_ = auVar79;
        auVar100 = vunpcklps_avx(auVar54,auVar62);
        auVar50._16_16_ = auVar83;
        auVar50._0_16_ = *(undefined1 (*) [16])(lVar9 + (long)p_Var8 * uVar35);
        auVar49 = vunpcklps_avx(auVar50,auVar92);
        auVar13 = vunpcklps_avx(auVar49,auVar100);
        auVar12 = vunpckhps_avx(auVar49,auVar100);
        auVar100 = vunpckhps_avx(auVar54,auVar62);
        auVar49 = vunpckhps_avx(auVar50,auVar92);
        auVar54 = vunpcklps_avx(auVar49,auVar100);
        auVar51._16_16_ = auVar81;
        auVar51._0_16_ = auVar81;
        auVar55._16_16_ = auVar59;
        auVar55._0_16_ = auVar59;
        auVar84._16_16_ = auVar80;
        auVar84._0_16_ = auVar80;
        auVar89._16_16_ = auVar82;
        auVar89._0_16_ = auVar82;
        auVar98._16_16_ = auVar61;
        auVar98._0_16_ = auVar61;
        auVar102._16_16_ = auVar76;
        auVar102._0_16_ = auVar76;
        auVar49 = vsubps_avx(auVar13,auVar51);
        auVar100 = vsubps_avx(auVar12,auVar55);
        auVar53 = vsubps_avx(auVar54,auVar84);
        auVar50 = vsubps_avx(auVar89,auVar13);
        auVar10 = vsubps_avx(auVar98,auVar12);
        auVar11 = vsubps_avx(auVar102,auVar54);
        auVar20._4_4_ = auVar100._4_4_ * auVar11._4_4_;
        auVar20._0_4_ = auVar100._0_4_ * auVar11._0_4_;
        auVar20._8_4_ = auVar100._8_4_ * auVar11._8_4_;
        auVar20._12_4_ = auVar100._12_4_ * auVar11._12_4_;
        auVar20._16_4_ = auVar100._16_4_ * auVar11._16_4_;
        auVar20._20_4_ = auVar100._20_4_ * auVar11._20_4_;
        auVar20._24_4_ = auVar100._24_4_ * auVar11._24_4_;
        auVar20._28_4_ = auVar81._12_4_;
        auVar60 = vfmsub231ps_fma(auVar20,auVar10,auVar53);
        auVar21._4_4_ = auVar53._4_4_ * auVar50._4_4_;
        auVar21._0_4_ = auVar53._0_4_ * auVar50._0_4_;
        auVar21._8_4_ = auVar53._8_4_ * auVar50._8_4_;
        auVar21._12_4_ = auVar53._12_4_ * auVar50._12_4_;
        auVar21._16_4_ = auVar53._16_4_ * auVar50._16_4_;
        auVar21._20_4_ = auVar53._20_4_ * auVar50._20_4_;
        auVar21._24_4_ = auVar53._24_4_ * auVar50._24_4_;
        auVar21._28_4_ = auVar59._12_4_;
        auVar59 = vfmsub231ps_fma(auVar21,auVar11,auVar49);
        uVar28 = *(undefined4 *)(ray + k * 4);
        auVar105._4_4_ = uVar28;
        auVar105._0_4_ = uVar28;
        auVar105._8_4_ = uVar28;
        auVar105._12_4_ = uVar28;
        auVar105._16_4_ = uVar28;
        auVar105._20_4_ = uVar28;
        auVar105._24_4_ = uVar28;
        auVar105._28_4_ = uVar28;
        uVar28 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar108._4_4_ = uVar28;
        auVar108._0_4_ = uVar28;
        auVar108._8_4_ = uVar28;
        auVar108._12_4_ = uVar28;
        auVar108._16_4_ = uVar28;
        auVar108._20_4_ = uVar28;
        auVar108._24_4_ = uVar28;
        auVar108._28_4_ = uVar28;
        uVar28 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar111._4_4_ = uVar28;
        auVar111._0_4_ = uVar28;
        auVar111._8_4_ = uVar28;
        auVar111._12_4_ = uVar28;
        auVar111._16_4_ = uVar28;
        auVar111._20_4_ = uVar28;
        auVar111._24_4_ = uVar28;
        auVar111._28_4_ = uVar28;
        fVar101 = *(float *)(ray + k * 4 + 0x80);
        auVar99._4_4_ = fVar101;
        auVar99._0_4_ = fVar101;
        auVar99._8_4_ = fVar101;
        auVar99._12_4_ = fVar101;
        auVar99._16_4_ = fVar101;
        auVar99._20_4_ = fVar101;
        auVar99._24_4_ = fVar101;
        auVar99._28_4_ = fVar101;
        auVar13 = vsubps_avx(auVar13,auVar105);
        fVar2 = *(float *)(ray + k * 4 + 0xa0);
        auVar106._4_4_ = fVar2;
        auVar106._0_4_ = fVar2;
        auVar106._8_4_ = fVar2;
        auVar106._12_4_ = fVar2;
        auVar106._16_4_ = fVar2;
        auVar106._20_4_ = fVar2;
        auVar106._24_4_ = fVar2;
        auVar106._28_4_ = fVar2;
        auVar12 = vsubps_avx(auVar12,auVar108);
        fVar3 = *(float *)(ray + k * 4 + 0xc0);
        auVar109._4_4_ = fVar3;
        auVar109._0_4_ = fVar3;
        auVar109._8_4_ = fVar3;
        auVar109._12_4_ = fVar3;
        auVar109._16_4_ = fVar3;
        auVar109._20_4_ = fVar3;
        auVar109._24_4_ = fVar3;
        auVar109._28_4_ = fVar3;
        auVar54 = vsubps_avx(auVar54,auVar111);
        auVar22._4_4_ = fVar101 * auVar12._4_4_;
        auVar22._0_4_ = fVar101 * auVar12._0_4_;
        auVar22._8_4_ = fVar101 * auVar12._8_4_;
        auVar22._12_4_ = fVar101 * auVar12._12_4_;
        auVar22._16_4_ = fVar101 * auVar12._16_4_;
        auVar22._20_4_ = fVar101 * auVar12._20_4_;
        auVar22._24_4_ = fVar101 * auVar12._24_4_;
        auVar22._28_4_ = uVar28;
        auVar79 = vfmsub231ps_fma(auVar22,auVar13,auVar106);
        auVar23._4_4_ = auVar11._4_4_ * auVar79._4_4_;
        auVar23._0_4_ = auVar11._0_4_ * auVar79._0_4_;
        auVar23._8_4_ = auVar11._8_4_ * auVar79._8_4_;
        auVar23._12_4_ = auVar11._12_4_ * auVar79._12_4_;
        auVar23._16_4_ = auVar11._16_4_ * 0.0;
        auVar23._20_4_ = auVar11._20_4_ * 0.0;
        auVar23._24_4_ = auVar11._24_4_ * 0.0;
        auVar23._28_4_ = auVar11._28_4_;
        auVar11._4_4_ = auVar53._4_4_ * auVar79._4_4_;
        auVar11._0_4_ = auVar53._0_4_ * auVar79._0_4_;
        auVar11._8_4_ = auVar53._8_4_ * auVar79._8_4_;
        auVar11._12_4_ = auVar53._12_4_ * auVar79._12_4_;
        auVar11._16_4_ = auVar53._16_4_ * 0.0;
        auVar11._20_4_ = auVar53._20_4_ * 0.0;
        auVar11._24_4_ = auVar53._24_4_ * 0.0;
        auVar11._28_4_ = auVar53._28_4_;
        auVar112._0_4_ = fVar3 * auVar13._0_4_;
        auVar112._4_4_ = fVar3 * auVar13._4_4_;
        auVar112._8_4_ = fVar3 * auVar13._8_4_;
        auVar112._12_4_ = fVar3 * auVar13._12_4_;
        auVar112._16_4_ = fVar3 * auVar13._16_4_;
        auVar112._20_4_ = fVar3 * auVar13._20_4_;
        auVar112._24_4_ = fVar3 * auVar13._24_4_;
        auVar112._28_4_ = 0;
        auVar48 = vfmsub231ps_fma(auVar112,auVar54,auVar99);
        auVar79 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar48),auVar10);
        auVar48 = vfmadd231ps_fma(auVar11,auVar100,ZEXT1632(auVar48));
        auVar24._4_4_ = auVar49._4_4_ * auVar10._4_4_;
        auVar24._0_4_ = auVar49._0_4_ * auVar10._0_4_;
        auVar24._8_4_ = auVar49._8_4_ * auVar10._8_4_;
        auVar24._12_4_ = auVar49._12_4_ * auVar10._12_4_;
        auVar24._16_4_ = auVar49._16_4_ * auVar10._16_4_;
        auVar24._20_4_ = auVar49._20_4_ * auVar10._20_4_;
        auVar24._24_4_ = auVar49._24_4_ * auVar10._24_4_;
        auVar24._28_4_ = auVar10._28_4_;
        auVar83 = vfmsub231ps_fma(auVar24,auVar50,auVar100);
        auVar113._0_4_ = fVar2 * auVar54._0_4_;
        auVar113._4_4_ = fVar2 * auVar54._4_4_;
        auVar113._8_4_ = fVar2 * auVar54._8_4_;
        auVar113._12_4_ = fVar2 * auVar54._12_4_;
        auVar113._16_4_ = fVar2 * auVar54._16_4_;
        auVar113._20_4_ = fVar2 * auVar54._20_4_;
        auVar113._24_4_ = fVar2 * auVar54._24_4_;
        auVar113._28_4_ = 0;
        auVar61 = vfmsub231ps_fma(auVar113,auVar12,auVar109);
        fVar101 = auVar83._0_4_;
        fVar2 = auVar83._4_4_;
        auVar10._4_4_ = fVar3 * fVar2;
        auVar10._0_4_ = fVar3 * fVar101;
        fVar58 = auVar83._8_4_;
        auVar10._8_4_ = fVar3 * fVar58;
        fVar67 = auVar83._12_4_;
        auVar10._12_4_ = fVar3 * fVar67;
        auVar10._16_4_ = fVar3 * 0.0;
        auVar10._20_4_ = fVar3 * 0.0;
        auVar10._24_4_ = fVar3 * 0.0;
        auVar10._28_4_ = fVar3;
        auVar83 = vfmadd231ps_fma(auVar10,ZEXT1632(auVar59),auVar106);
        auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar60),auVar99);
        auVar93._8_4_ = 0x80000000;
        auVar93._0_8_ = 0x8000000080000000;
        auVar93._12_4_ = 0x80000000;
        auVar93._16_4_ = 0x80000000;
        auVar93._20_4_ = 0x80000000;
        auVar93._24_4_ = 0x80000000;
        auVar93._28_4_ = 0x80000000;
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),ZEXT1632(auVar61),auVar50);
        auVar100 = vandps_avx(ZEXT1632(auVar83),auVar93);
        uVar6 = auVar100._0_4_;
        auVar94._0_4_ = (float)(auVar79._0_4_ ^ uVar6);
        uVar14 = auVar100._4_4_;
        auVar94._4_4_ = (float)(auVar79._4_4_ ^ uVar14);
        uVar15 = auVar100._8_4_;
        auVar94._8_4_ = (float)(auVar79._8_4_ ^ uVar15);
        uVar16 = auVar100._12_4_;
        auVar94._12_4_ = (float)(auVar79._12_4_ ^ uVar16);
        fVar3 = auVar100._16_4_;
        auVar94._16_4_ = fVar3;
        fVar17 = auVar100._20_4_;
        auVar94._20_4_ = fVar17;
        fVar18 = auVar100._24_4_;
        auVar94._24_4_ = fVar18;
        fVar19 = auVar100._28_4_;
        auVar94._28_4_ = fVar19;
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar49,ZEXT1632(auVar61));
        auVar96._0_4_ = (float)(auVar79._0_4_ ^ uVar6);
        auVar96._4_4_ = (float)(auVar79._4_4_ ^ uVar14);
        auVar96._8_4_ = (float)(auVar79._8_4_ ^ uVar15);
        auVar96._12_4_ = (float)(auVar79._12_4_ ^ uVar16);
        auVar96._16_4_ = fVar3;
        auVar96._20_4_ = fVar17;
        auVar96._24_4_ = fVar18;
        auVar96._28_4_ = fVar19;
        auVar100 = vcmpps_avx(auVar94,ZEXT832(0) << 0x20,5);
        auVar49 = vcmpps_avx(auVar96,ZEXT832(0) << 0x20,5);
        auVar100 = vandps_avx(auVar49,auVar100);
        auVar63._8_4_ = 0x7fffffff;
        auVar63._0_8_ = 0x7fffffff7fffffff;
        auVar63._12_4_ = 0x7fffffff;
        auVar63._16_4_ = 0x7fffffff;
        auVar63._20_4_ = 0x7fffffff;
        auVar63._24_4_ = 0x7fffffff;
        auVar63._28_4_ = 0x7fffffff;
        local_a40 = vandps_avx(ZEXT1632(auVar83),auVar63);
        auVar49 = vcmpps_avx(ZEXT1632(auVar83),ZEXT832(0) << 0x20,4);
        auVar100 = vandps_avx(auVar100,auVar49);
        auVar103._0_4_ = auVar94._0_4_ + auVar96._0_4_;
        auVar103._4_4_ = auVar94._4_4_ + auVar96._4_4_;
        auVar103._8_4_ = auVar94._8_4_ + auVar96._8_4_;
        auVar103._12_4_ = auVar94._12_4_ + auVar96._12_4_;
        auVar103._16_4_ = fVar3 + fVar3;
        auVar103._20_4_ = fVar17 + fVar17;
        auVar103._24_4_ = fVar18 + fVar18;
        auVar103._28_4_ = fVar19 + fVar19;
        auVar49 = vcmpps_avx(auVar103,local_a40,2);
        auVar53 = auVar49 & auVar100;
        if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar53 >> 0x7f,0) != '\0') ||
              (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar53 >> 0xbf,0) != '\0') ||
            (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar53[0x1f] < '\0') {
          auVar100 = vandps_avx(auVar100,auVar49);
          auVar79 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
          auVar25._4_4_ = fVar2 * auVar54._4_4_;
          auVar25._0_4_ = fVar101 * auVar54._0_4_;
          auVar25._8_4_ = fVar58 * auVar54._8_4_;
          auVar25._12_4_ = fVar67 * auVar54._12_4_;
          auVar25._16_4_ = auVar54._16_4_ * 0.0;
          auVar25._20_4_ = auVar54._20_4_ * 0.0;
          auVar25._24_4_ = auVar54._24_4_ * 0.0;
          auVar25._28_4_ = auVar54._28_4_;
          auVar48 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar59),auVar25);
          auVar48 = vfmadd213ps_fma(auVar13,ZEXT1632(auVar60),ZEXT1632(auVar48));
          local_a60._0_4_ = (float)(uVar6 ^ auVar48._0_4_);
          local_a60._4_4_ = (float)(uVar14 ^ auVar48._4_4_);
          local_a60._8_4_ = (float)(uVar15 ^ auVar48._8_4_);
          local_a60._12_4_ = (float)(uVar16 ^ auVar48._12_4_);
          local_a60._16_4_ = fVar3;
          local_a60._20_4_ = fVar17;
          local_a60._24_4_ = fVar18;
          local_a60._28_4_ = fVar19;
          fVar69 = *(float *)(ray + k * 4 + 0x60);
          fVar57 = local_a40._0_4_;
          fVar66 = local_a40._4_4_;
          auVar13._4_4_ = fVar66 * fVar69;
          auVar13._0_4_ = fVar57 * fVar69;
          fVar68 = local_a40._8_4_;
          auVar13._8_4_ = fVar68 * fVar69;
          fVar70 = local_a40._12_4_;
          auVar13._12_4_ = fVar70 * fVar69;
          fVar72 = local_a40._16_4_;
          auVar13._16_4_ = fVar72 * fVar69;
          fVar73 = local_a40._20_4_;
          auVar13._20_4_ = fVar73 * fVar69;
          fVar74 = local_a40._24_4_;
          auVar13._24_4_ = fVar74 * fVar69;
          auVar13._28_4_ = fVar69;
          auVar100 = vcmpps_avx(auVar13,local_a60,1);
          local_bc0 = *(float *)(ray + k * 4 + 0x100);
          auVar12._4_4_ = fVar66 * local_bc0;
          auVar12._0_4_ = fVar57 * local_bc0;
          auVar12._8_4_ = fVar68 * local_bc0;
          auVar12._12_4_ = fVar70 * local_bc0;
          auVar12._16_4_ = fVar72 * local_bc0;
          auVar12._20_4_ = fVar73 * local_bc0;
          auVar12._24_4_ = fVar74 * local_bc0;
          auVar12._28_4_ = auVar54._28_4_;
          auVar49 = vcmpps_avx(local_a60,auVar12,2);
          auVar100 = vandps_avx(auVar100,auVar49);
          auVar48 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
          auVar79 = vpand_avx(auVar79,auVar48);
          auVar100 = vpmovzxwd_avx2(auVar79);
          auVar100 = vpslld_avx2(auVar100,0x1f);
          if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar100 >> 0x7f,0) != '\0') ||
                (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0xbf,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar100[0x1f] < '\0') {
            auVar49 = vsubps_avx(local_a40,auVar96);
            local_aa0 = vblendvps_avx(auVar94,auVar49,local_ac0);
            auVar49 = vsubps_avx(local_a40,auVar94);
            local_a80 = vblendvps_avx(auVar96,auVar49,local_ac0);
            local_a00 = vpsrad_avx2(auVar100,0x1f);
            local_980._0_4_ = (float)local_ae0._0_4_ * auVar60._0_4_;
            local_980._4_4_ = (float)local_ae0._4_4_ * auVar60._4_4_;
            local_980._8_4_ = fStack_ad8 * auVar60._8_4_;
            local_980._12_4_ = fStack_ad4 * auVar60._12_4_;
            local_980._16_4_ = fStack_ad0 * 0.0;
            local_980._20_4_ = fStack_acc * 0.0;
            local_980._24_4_ = fStack_ac8 * 0.0;
            local_980._28_4_ = 0;
            local_960._4_4_ = (float)local_ae0._4_4_ * auVar59._4_4_;
            local_960._0_4_ = (float)local_ae0._0_4_ * auVar59._0_4_;
            local_960._8_4_ = fStack_ad8 * auVar59._8_4_;
            local_960._12_4_ = fStack_ad4 * auVar59._12_4_;
            local_960._16_4_ = fStack_ad0 * 0.0;
            local_960._20_4_ = fStack_acc * 0.0;
            local_960._24_4_ = fStack_ac8 * 0.0;
            local_960._28_4_ = 0;
            local_940._4_4_ = (float)local_ae0._4_4_ * fVar2;
            local_940._0_4_ = (float)local_ae0._0_4_ * fVar101;
            local_940._8_4_ = fStack_ad8 * fVar58;
            local_940._12_4_ = fStack_ad4 * fVar67;
            local_940._16_4_ = fStack_ad0 * 0.0;
            local_940._20_4_ = fStack_acc * 0.0;
            local_940._24_4_ = fStack_ac8 * 0.0;
            local_940._28_4_ = 0;
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01626396:
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_016263b0;
              }
              auVar52._0_8_ = (ulong)CONCAT24(uVar4,(uint)uVar4) & 0x7fff00007fff;
              auVar52._8_4_ = uVar37;
              auVar52._12_4_ = uVar37;
              auVar52._16_4_ = uVar37;
              auVar52._20_4_ = uVar37;
              auVar52._24_4_ = uVar37;
              auVar52._28_4_ = uVar37;
              auVar100 = vpaddd_avx2(auVar52,_DAT_01fb7740);
              auVar56._0_8_ = (ulong)CONCAT24(uVar5,(uint)uVar5) & 0x7fff00007fff;
              auVar56._8_4_ = uVar38;
              auVar56._12_4_ = uVar38;
              auVar56._16_4_ = uVar38;
              auVar56._20_4_ = uVar38;
              auVar56._24_4_ = uVar38;
              auVar56._28_4_ = uVar38;
              auVar49 = vpaddd_avx2(auVar56,_DAT_01fb7760);
              auVar83._0_4_ = (float)(int)(*(ushort *)(lVar30 + 8 + lVar42) - 1);
              auVar83._4_12_ = auVar114._4_12_;
              auVar48 = vrcpss_avx(auVar83,auVar83);
              auVar83 = vfnmadd213ss_fma(auVar83,auVar48,SUB6416(ZEXT464(0x40000000),0));
              fVar101 = auVar48._0_4_ * auVar83._0_4_;
              auVar91._0_4_ = (float)(int)(*(ushort *)(lVar30 + 10 + lVar42) - 1);
              auVar91._4_12_ = auVar114._4_12_;
              auVar48 = vrcpss_avx(auVar91,auVar91);
              auVar83 = vfnmadd213ss_fma(auVar91,auVar48,SUB6416(ZEXT464(0x40000000),0));
              fVar2 = auVar48._0_4_ * auVar83._0_4_;
              auVar100 = vcvtdq2ps_avx(auVar100);
              fStack_9c4 = auVar100._28_4_ + local_aa0._28_4_;
              auVar49 = vcvtdq2ps_avx(auVar49);
              auVar53 = vrcpps_avx(local_a40);
              auVar86._8_4_ = 0x3f800000;
              auVar86._0_8_ = 0x3f8000003f800000;
              auVar86._12_4_ = 0x3f800000;
              auVar86._16_4_ = 0x3f800000;
              auVar86._20_4_ = 0x3f800000;
              auVar86._24_4_ = 0x3f800000;
              auVar86._28_4_ = 0x3f800000;
              auVar48 = vfnmadd213ps_fma(local_a40,auVar53,auVar86);
              auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar53,auVar53);
              fVar58 = auVar48._0_4_;
              fVar67 = auVar48._4_4_;
              local_9a0._4_4_ = fVar67 * local_a60._4_4_;
              local_9a0._0_4_ = fVar58 * local_a60._0_4_;
              fVar69 = auVar48._8_4_;
              local_9a0._8_4_ = fVar69 * local_a60._8_4_;
              fVar71 = auVar48._12_4_;
              local_9a0._12_4_ = fVar71 * local_a60._12_4_;
              local_9a0._16_4_ = fVar3 * 0.0;
              local_9a0._20_4_ = fVar17 * 0.0;
              local_9a0._24_4_ = fVar18 * 0.0;
              local_9a0._28_4_ = fVar19;
              local_9e0[0] = (fVar57 * auVar100._0_4_ + local_aa0._0_4_) * fVar101 * fVar58;
              local_9e0[1] = (fVar66 * auVar100._4_4_ + local_aa0._4_4_) * fVar101 * fVar67;
              local_9e0[2] = (fVar68 * auVar100._8_4_ + local_aa0._8_4_) * fVar101 * fVar69;
              local_9e0[3] = (fVar70 * auVar100._12_4_ + local_aa0._12_4_) * fVar101 * fVar71;
              fStack_9d0 = (fVar72 * auVar100._16_4_ + local_aa0._16_4_) * fVar101 * 0.0;
              fStack_9cc = (fVar73 * auVar100._20_4_ + local_aa0._20_4_) * fVar101 * 0.0;
              fStack_9c8 = (fVar74 * auVar100._24_4_ + local_aa0._24_4_) * fVar101 * 0.0;
              local_9c0[0] = (fVar57 * auVar49._0_4_ + local_a80._0_4_) * fVar2 * fVar58;
              local_9c0[1] = (fVar66 * auVar49._4_4_ + local_a80._4_4_) * fVar2 * fVar67;
              local_9c0[2] = (fVar68 * auVar49._8_4_ + local_a80._8_4_) * fVar2 * fVar69;
              local_9c0[3] = (fVar70 * auVar49._12_4_ + local_a80._12_4_) * fVar2 * fVar71;
              fStack_9b0 = (fVar72 * auVar49._16_4_ + local_a80._16_4_) * fVar2 * 0.0;
              fStack_9ac = (fVar73 * auVar49._20_4_ + local_a80._20_4_) * fVar2 * 0.0;
              fStack_9a8 = (fVar74 * auVar49._24_4_ + local_a80._24_4_) * fVar2 * 0.0;
              fStack_9a4 = fStack_9c4;
              auVar79 = vpsllw_avx(auVar79,0xf);
              auVar79 = vpacksswb_avx(auVar79,auVar79);
              uVar44 = 0;
              uVar46 = (ulong)(byte)(SUB161(auVar79 >> 7,0) & 1 |
                                     (SUB161(auVar79 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar79 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar79 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar79 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar79 >> 0x3f,0) << 7);
              for (uVar35 = uVar46; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                uVar44 = uVar44 + 1;
              }
              local_b80 = CONCAT44(uStack_b78,uStack_b78);
              local_ba0._4_4_ = uVar32;
              local_ba0._0_4_ = uVar32;
              local_ba0._8_4_ = uVar32;
              local_ba0._12_4_ = uVar32;
              local_ba0._16_4_ = uVar32;
              local_ba0._20_4_ = uVar32;
              local_ba0._24_4_ = uVar32;
              local_ba0._28_4_ = uVar32;
              auVar79 = auVar114._0_16_;
              fStack_bbc = local_bc0;
              fStack_bb8 = local_bc0;
              fStack_bb4 = local_bc0;
              fStack_bb0 = local_bc0;
              fStack_bac = local_bc0;
              fStack_ba8 = local_bc0;
              fStack_ba4 = local_bc0;
              uStack_b74 = uStack_b78;
              uStack_b70 = uStack_b78;
              uStack_b6c = uStack_b78;
              uStack_b68 = uStack_b78;
              uStack_b64 = uStack_b78;
              fVar101 = local_bc0;
              while (uVar46 != 0) {
                local_8c0 = local_9e0[uVar44];
                local_8a0 = local_9c0[uVar44];
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9a0 + uVar44 * 4);
                uVar28 = *(undefined4 *)(local_980 + uVar44 * 4);
                auVar64._4_4_ = uVar28;
                auVar64._0_4_ = uVar28;
                auVar64._8_4_ = uVar28;
                auVar64._12_4_ = uVar28;
                auVar64._16_4_ = uVar28;
                auVar64._20_4_ = uVar28;
                auVar64._24_4_ = uVar28;
                auVar64._28_4_ = uVar28;
                uVar33 = *(undefined4 *)(local_960 + uVar44 * 4);
                local_900._4_4_ = uVar33;
                local_900._0_4_ = uVar33;
                local_900._8_4_ = uVar33;
                local_900._12_4_ = uVar33;
                local_900._16_4_ = uVar33;
                local_900._20_4_ = uVar33;
                local_900._24_4_ = uVar33;
                local_900._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(local_940 + uVar44 * 4);
                local_8e0._4_4_ = uVar33;
                local_8e0._0_4_ = uVar33;
                local_8e0._8_4_ = uVar33;
                local_8e0._12_4_ = uVar33;
                local_8e0._16_4_ = uVar33;
                local_8e0._20_4_ = uVar33;
                local_8e0._24_4_ = uVar33;
                local_8e0._28_4_ = uVar33;
                local_bf0.context = context->user;
                local_920[0] = (RTCHitN)(char)uVar28;
                local_920[1] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_920[4] = (RTCHitN)(char)uVar28;
                local_920[5] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_920[8] = (RTCHitN)(char)uVar28;
                local_920[9] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_920[0xc] = (RTCHitN)(char)uVar28;
                local_920[0xd] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_920[0x10] = (RTCHitN)(char)uVar28;
                local_920[0x11] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_920[0x14] = (RTCHitN)(char)uVar28;
                local_920[0x15] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_920[0x18] = (RTCHitN)(char)uVar28;
                local_920[0x19] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_920[0x1c] = (RTCHitN)(char)uVar28;
                local_920[0x1d] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                fStack_8bc = local_8c0;
                fStack_8b8 = local_8c0;
                fStack_8b4 = local_8c0;
                fStack_8b0 = local_8c0;
                fStack_8ac = local_8c0;
                fStack_8a8 = local_8c0;
                fStack_8a4 = local_8c0;
                fStack_89c = local_8a0;
                fStack_898 = local_8a0;
                fStack_894 = local_8a0;
                fStack_890 = local_8a0;
                fStack_88c = local_8a0;
                fStack_888 = local_8a0;
                fStack_884 = local_8a0;
                local_880 = local_ba0._0_8_;
                uStack_878 = local_ba0._8_8_;
                uStack_870 = local_ba0._16_8_;
                uStack_868 = local_ba0._24_8_;
                local_860 = local_b80;
                uStack_858 = CONCAT44(uStack_b74,uStack_b78);
                uStack_850 = CONCAT44(uStack_b6c,uStack_b70);
                uStack_848 = CONCAT44(uStack_b64,uStack_b68);
                auVar100 = vpcmpeqd_avx2(auVar64,auVar64);
                uStack_83c = (local_bf0.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_bf0.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_b60 = local_b00;
                local_bf0.valid = (int *)local_b60;
                local_bf0.geometryUserPtr = pGVar7->userPtr;
                local_bf0.hit = local_920;
                local_bf0.N = 8;
                local_bf0.ray = (RTCRayN *)ray;
                if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar100 = ZEXT1632(auVar100._0_16_);
                  (*pGVar7->occlusionFilterN)(&local_bf0);
                  auVar100 = vpcmpeqd_avx2(auVar100,auVar100);
                  auVar114 = ZEXT1664(auVar79);
                  fVar101 = local_bc0;
                }
                auVar53 = vpcmpeqd_avx2(local_b60,_DAT_01f7b000);
                auVar49 = auVar100 & ~auVar53;
                if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar49 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar49 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar49 >> 0x7f,0) == '\0') &&
                      (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar49 >> 0xbf,0) == '\0') &&
                    (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar49[0x1f]) {
                  auVar53 = auVar53 ^ auVar100;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar100 = ZEXT1632(auVar100._0_16_);
                    (*p_Var8)(&local_bf0);
                    auVar100 = vpcmpeqd_avx2(auVar100,auVar100);
                    auVar114 = ZEXT1664(auVar79);
                    fVar101 = local_bc0;
                  }
                  auVar49 = vpcmpeqd_avx2(local_b60,_DAT_01f7b000);
                  auVar53 = auVar49 ^ auVar100;
                  auVar65._8_4_ = 0xff800000;
                  auVar65._0_8_ = 0xff800000ff800000;
                  auVar65._12_4_ = 0xff800000;
                  auVar65._16_4_ = 0xff800000;
                  auVar65._20_4_ = 0xff800000;
                  auVar65._24_4_ = 0xff800000;
                  auVar65._28_4_ = 0xff800000;
                  auVar100 = vblendvps_avx(auVar65,*(undefined1 (*) [32])(local_bf0.ray + 0x100),
                                           auVar49);
                  *(undefined1 (*) [32])(local_bf0.ray + 0x100) = auVar100;
                }
                if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar53 >> 0x7f,0) != '\0') ||
                      (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar53 >> 0xbf,0) != '\0') ||
                    (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar53[0x1f] < '\0') goto LAB_01626396;
                *(float *)(ray + k * 4 + 0x100) = fVar101;
                uVar35 = uVar44 & 0x3f;
                uVar44 = 0;
                uVar46 = uVar46 ^ 1L << uVar35;
                for (uVar35 = uVar46; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000)
                {
                  uVar44 = uVar44 + 1;
                }
              }
            }
          }
        }
      }
      auVar87 = ZEXT1664(local_b10);
      auVar90 = ZEXT1664(local_b20);
      auVar95 = ZEXT1664(local_b30);
      auVar97 = ZEXT1664(local_b40);
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }